

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O0

void __thiscall COLLADASaxFWL::KinematicLink::~KinematicLink(KinematicLink *this)

{
  KinematicLink *in_RDI;
  
  ~KinematicLink(in_RDI);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

~KinematicLink(){ deleteVector(mAttachments); deleteVector(mTransformations); }